

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix_tests.cc
# Opt level: O0

void __thiscall
lf::assemble::test::lf_assembly_fix_dof_flags_alt_Test::TestBody
          (lf_assembly_fix_dof_flags_alt_Test *this)

{
  bool bVar1;
  int iVar2;
  ComputationInfo CVar3;
  ostream *poVar4;
  Scalar *pSVar5;
  reference pvVar6;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar7;
  Message *message;
  char *message_00;
  RealScalar val1;
  reference rVar8;
  AssertHelper local_4a0;
  Message local_498;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_490;
  undefined1 local_478 [8];
  AssertionResult gtest_ar;
  Scalar local_460;
  Scalar local_458;
  Scalar local_450;
  Scalar local_448;
  Scalar local_440;
  Scalar local_438;
  Scalar local_430;
  Scalar local_428;
  Scalar local_420;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_418;
  undefined1 local_3f8 [8];
  VectorXd exact;
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_3e0;
  undefined1 local_3d0 [8];
  VectorXd x;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  SparseMatrix<double,_0,_int> stiffness_matrix;
  Matrix<double,__1,__1,_0,__1,__1> local_128;
  anon_class_16_2_f740b662 local_110;
  allocator<double> local_f9;
  value_type_conflict4 local_f8;
  undefined1 local_f0 [8];
  vector<double,_std::allocator<double>_> valvec;
  reference local_c8;
  reference local_b8;
  allocator<bool> local_a2;
  bool local_a1;
  undefined1 local_a0 [8];
  vector<bool,_std::allocator<bool>_> flagvec;
  Matrix<double,__1,__1,_0,__1,__1> local_70;
  int local_58;
  int k;
  undefined1 local_48 [8];
  VectorXd b;
  COOMatrix<double> A;
  int N;
  lf_assembly_fix_dof_flags_alt_Test *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Test for fixing solution components");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  A.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 10;
  COOMatrix<double>::COOMatrix
            ((COOMatrix<double> *)
             &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,10,
             10);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_48,
             (int *)((long)&A.triplets_.
                            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  for (local_58 = 0; local_58 < 10; local_58 = local_58 + 1) {
    if (0 < local_58) {
      COOMatrix<double>::AddToEntry
                ((COOMatrix<double> *)
                 &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (long)local_58,(long)(local_58 + -1),-1.0);
    }
    if (local_58 < 9) {
      COOMatrix<double>::AddToEntry
                ((COOMatrix<double> *)
                 &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (long)local_58,(long)(local_58 + 1),-1.0);
    }
    COOMatrix<double>::AddToEntry
              ((COOMatrix<double> *)
               &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (long)local_58,(long)local_58,2.0);
    iVar2 = local_58 + 1;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_48,
                        (long)local_58);
    *pSVar5 = (double)iVar2;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Matrix A = \n");
  COOMatrix<double>::makeDense
            (&local_70,
             (COOMatrix<double> *)
             &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    &local_70);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_70);
  poVar4 = std::operator<<((ostream *)&std::cout,"rhs = ");
  flagvec.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       (_Bit_pointer)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&flagvec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_a1 = false;
  std::allocator<bool>::allocator(&local_a2);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_a0,10,&local_a1,&local_a2);
  std::allocator<bool>::~allocator(&local_a2);
  local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_a0,2);
  std::_Bit_reference::operator=(&local_b8,true);
  local_c8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_a0,4);
  std::_Bit_reference::operator=(&local_c8,true);
  rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)local_a0,8);
  valvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)rVar8._M_p;
  std::_Bit_reference::operator=
            ((_Bit_reference *)
             &valvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true);
  local_f8 = 1.0;
  std::allocator<double>::allocator(&local_f9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_f0,10,&local_f8,&local_f9);
  std::allocator<double>::~allocator(&local_f9);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_f0,2);
  *pvVar6 = -1.0;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_f0,4);
  *pvVar6 = -2.0;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_f0,8);
  *pvVar6 = -3.0;
  local_110.flagvec = (vector<bool,_std::allocator<bool>_> *)local_a0;
  local_110.valvec = (vector<double,_std::allocator<double>_> *)local_f0;
  FixFlaggedSolutionCompAlt<double,lf::assemble::test::lf_assembly_fix_dof_flags_alt_Test::TestBody()::__0,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&local_110,
             (COOMatrix<double> *)
             &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_48);
  poVar4 = std::operator<<((ostream *)&std::cout,"Modified matrix A = \n");
  COOMatrix<double>::makeDense
            (&local_128,
             (COOMatrix<double> *)
             &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    &local_128);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_128);
  poVar4 = std::operator<<((ostream *)&std::cout,"Modified rhs = ");
  stiffness_matrix.m_data.m_allocatedSize =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&stiffness_matrix.m_data.m_allocatedSize);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  COOMatrix<double>::makeSparse
            ((SparseMatrix<double,_0,_int> *)&solver.m_detPermC,
             (COOMatrix<double> *)
             &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (MatrixType *)&solver.m_detPermC);
  local_3e0 = Eigen::
              SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
              ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                          *)&x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_3d0,
             (EigenBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_3e0);
  CVar3 = Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::info
                    ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                     &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows);
  if (CVar3 != Success) {
    poVar4 = std::operator<<((ostream *)&std::cout,"solver failed!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Solution x = ");
  exact.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3d0);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&exact.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_3f8,
             (int *)((long)&A.triplets_.
                            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_420 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_418,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3f8,&local_420);
  local_428 = 1.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_418,&local_428);
  local_430 = -1.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_430);
  local_438 = 0.5;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_438);
  local_440 = -2.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_440);
  local_448 = 7.75;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_448);
  local_450 = 11.5;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_450);
  local_458 = 8.25;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_458);
  local_460 = -3.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_460);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x400c000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar7,(Scalar *)&gtest_ar.message_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_418);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_490,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_3d0,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3f8);
  val1 = Eigen::
         MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
         ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_490);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_478,"(x - exact).norm()","0.0","1.0E-12",val1,0.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    message = testing::Message::operator<<(&local_498,(char (*) [14])"Wrong result!");
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/coomatrix_tests.cc"
               ,0xb2,message_00);
    testing::internal::AssertHelper::operator=(&local_4a0,message);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_3f8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_3d0);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
            ((SparseMatrix<double,_0,_int> *)&solver.m_detPermC);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_f0);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_a0)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_48);
  COOMatrix<double>::~COOMatrix
            ((COOMatrix<double> *)
             &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  return;
}

Assistant:

TEST(lf_assembly, fix_dof_flags_alt) {
  std::cout << "Test for fixing solution components" << std::endl;
  // Size of matrix
  const int N = 10;
  // Create 8x10 matrix in COO format: all zero in the beginning
  COOMatrix<double> A(N, N);
  // Right-hand-side vector
  Eigen::VectorXd b(N);
  for (int k = 0; k < N; k++) {
    if (k > 0) {
      A.AddToEntry(k, k - 1, -1.0);
    }
    if (k < N - 1) {
      A.AddToEntry(k, k + 1, -1.0);
    }
    A.AddToEntry(k, k, 2);
    b[k] = k + 1;
  }
  std::cout << "Matrix A = \n" << A.makeDense() << std::endl;
  std::cout << "rhs = " << b.transpose() << std::endl;

  // pass fixed solution components and flags as vectors
  std::vector<bool> flagvec(N, false);
  flagvec[2] = true;
  flagvec[4] = true;
  flagvec[8] = true;
  std::vector<double> valvec(N, 1.0);
  valvec[2] = -1.0;
  valvec[4] = -2.0;
  valvec[8] = -3.0;

  FixFlaggedSolutionCompAlt<double>(
      [&flagvec,
       &valvec](lf::assemble::gdof_idx_t i) -> std::pair<bool, double> {
        LF_ASSERT_MSG((i < flagvec.size()) && (i < valvec.size()),
                      "Illegal index " << i);
        return std::make_pair(flagvec[i], valvec[i]);
      },
      A, b);
  std::cout << "Modified matrix A = \n" << A.makeDense() << std::endl;
  std::cout << "Modified rhs = " << b.transpose() << std::endl;

  // Solve linear system
  // Initialize sparse matrix
  Eigen::SparseMatrix<double> stiffness_matrix(A.makeSparse());
  // Solve linear system
  Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
  solver.compute(stiffness_matrix);
  Eigen::VectorXd x = solver.solve(b);
  if (solver.info() != Eigen::Success) {
    std::cout << "solver failed!" << std::endl;
  }
  std::cout << "Solution x = " << x.transpose() << std::endl;
  Eigen::VectorXd exact(N);
  exact << 1, 1, -1, 0.5, -2, 7.75, 11.5, 8.25, -3, 3.5;
  EXPECT_NEAR((x - exact).norm(), 0.0, 1.0E-12) << "Wrong result!";
}